

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm.cpp
# Opt level: O0

void ncnn::gemm_transB(Mat *A,Mat *BT,Mat *C,Mat *top_blob,float alpha,float beta,
                      int broadcast_type_C,int output_transpose,Option *opt)

{
  int iVar1;
  void *pvVar2;
  float *pfVar3;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  float local_ac;
  int local_9c;
  int local_78;
  int k;
  float sum;
  float *ptrBT;
  int j;
  float *ptrC;
  float *ptrA;
  int BT_hstep;
  int A_hstep;
  int out_hstep;
  int i;
  int K;
  int N;
  int M;
  int output_transpose_local;
  int broadcast_type_C_local;
  float beta_local;
  float alpha_local;
  Mat *top_blob_local;
  Mat *C_local;
  
  if (A->dims == 3) {
    local_b4 = A->c;
  }
  else {
    local_b4 = A->h;
  }
  if (BT->dims == 3) {
    local_b8 = BT->c;
  }
  else {
    local_b8 = BT->h;
  }
  iVar1 = A->w;
  for (local_78 = 0; local_78 < local_b4; local_78 = local_78 + 1) {
    if (top_blob->dims == 3) {
      local_bc = (int)top_blob->cstep;
    }
    else {
      local_bc = top_blob->w;
    }
    if (A->dims == 3) {
      local_c0 = (int)A->cstep;
    }
    else {
      local_c0 = A->w;
    }
    if (BT->dims == 3) {
      local_c4 = (int)BT->cstep;
    }
    else {
      local_c4 = BT->w;
    }
    pvVar2 = A->data;
    pfVar3 = (float *)C->data;
    for (local_9c = 0; local_9c < local_b8; local_9c = local_9c + 1) {
      local_ac = 0.0;
      if (pfVar3 != (float *)0x0) {
        if (broadcast_type_C == 0) {
          local_ac = *pfVar3;
        }
        if (broadcast_type_C == 1) {
          local_ac = pfVar3[local_78];
        }
        if (broadcast_type_C == 2) {
          local_ac = pfVar3[local_78];
        }
        if (broadcast_type_C == 3) {
          local_ac = pfVar3[local_78 * local_b8 + local_9c];
        }
        if (broadcast_type_C == 4) {
          local_ac = pfVar3[local_9c];
        }
        local_ac = beta * local_ac;
      }
      for (local_b0 = 0; local_b0 < iVar1; local_b0 = local_b0 + 1) {
        local_ac = *(float *)((long)pvVar2 + (long)local_b0 * 4 + (long)(local_78 * local_c0) * 4) *
                   *(float *)((long)BT->data + (long)local_b0 * 4 + (long)(local_9c * local_c4) * 4)
                   + local_ac;
      }
      if (output_transpose == 0) {
        *(float *)((long)top_blob->data + (long)(local_78 * local_bc + local_9c) * 4) =
             alpha * local_ac;
      }
      else {
        *(float *)((long)top_blob->data + (long)(local_9c * local_bc + local_78) * 4) =
             alpha * local_ac;
      }
    }
  }
  return;
}

Assistant:

static void gemm_transB(const Mat& A, const Mat& BT, const Mat& C, Mat& top_blob, float alpha, float beta, int broadcast_type_C, int output_transpose, const Option& opt)
{
    const int M = A.dims == 3 ? A.c : A.h;
    const int N = BT.dims == 3 ? BT.c : BT.h;
    const int K = A.w; // assert A.w == BT.w

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < M; i++)
    {
        const int out_hstep = top_blob.dims == 3 ? (int)top_blob.cstep : top_blob.w;

        const int A_hstep = A.dims == 3 ? (int)A.cstep : A.w;
        const int BT_hstep = BT.dims == 3 ? (int)BT.cstep : BT.w;

        const float* ptrA = (const float*)A + i * A_hstep;
        const float* ptrC = C;

        for (int j = 0; j < N; j++)
        {
            const float* ptrBT = (const float*)BT + j * BT_hstep;

            float sum = 0.f;
            if (ptrC)
            {
                if (broadcast_type_C == 0)
                {
                    sum = ptrC[0];
                }
                if (broadcast_type_C == 1)
                {
                    sum = ptrC[i];
                }
                if (broadcast_type_C == 2)
                {
                    sum = ptrC[i];
                }
                if (broadcast_type_C == 3)
                {
                    sum = ptrC[i * N + j];
                }
                if (broadcast_type_C == 4)
                {
                    sum = ptrC[j];
                }

                sum *= beta;
            }

            for (int k = 0; k < K; k++)
            {
                sum += ptrA[k] * ptrBT[k];
            }

            sum *= alpha;

            if (output_transpose)
            {
                top_blob[j * out_hstep + i] = sum;
            }
            else
            {
                top_blob[i * out_hstep + j] = sum;
            }
        }
    }
}